

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc *psVar5;
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
LAB_0012bb7f:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar4 = (*(s->io).eof)(s->io_user_data);
      if (iVar4 == 0) goto LAB_0012bbad;
      if (s->read_from_callbacks != 0) goto LAB_0012bb9d;
LAB_0012bc24:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar4 = (*(s->io).eof)(s->io_user_data);
        if (iVar4 == 0) goto LAB_0012bc56;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_0012bc56:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012bc7d:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_0012bb7f;
        }
        else {
          iVar4 = (*(s->io).eof)(s->io_user_data);
          if (iVar4 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_0012bc7d;
            goto LAB_0012bb7f;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_0012bb7f;
        psVar5 = s->img_buffer;
        if (psVar5 < s->img_buffer_end) {
          s->img_buffer = psVar5 + 1;
          sVar3 = *psVar5;
        }
        else if (s->read_from_callbacks == 0) {
          sVar3 = '\0';
        }
        else {
          iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          s->callback_already_read =
               s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original)
          ;
          if (iVar4 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            sVar3 = '\0';
            psVar5 = psVar2;
          }
          else {
            sVar3 = *psVar1;
            psVar5 = psVar1 + iVar4;
          }
          s->img_buffer_end = psVar5;
          s->img_buffer = psVar2;
        }
        *c = sVar3;
      } while( true );
    }
LAB_0012bb9d:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0012bc24;
LAB_0012bbad:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_0012bc24;
    psVar5 = s->img_buffer;
    if (psVar5 < s->img_buffer_end) {
      s->img_buffer = psVar5 + 1;
      sVar3 = *psVar5;
    }
    else if (s->read_from_callbacks == 0) {
      sVar3 = '\0';
    }
    else {
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar3 = '\0';
        psVar5 = psVar2;
      }
      else {
        sVar3 = *psVar1;
        psVar5 = psVar1 + iVar4;
      }
      s->img_buffer_end = psVar5;
      s->img_buffer = psVar2;
    }
    *c = sVar3;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}